

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_s_motion_refs_1(xr_ogf_v4 *this,xr_reader *r)

{
  uint32_t uVar1;
  char *pcVar2;
  ulong local_20;
  uint_fast32_t n;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  uVar1 = xr_reader::r_u32(r);
  local_20 = (ulong)uVar1;
  while (local_20 != 0) {
    pcVar2 = xr_reader::skip_sz(r);
    std::__cxx11::string::operator+=
              ((string *)&(this->super_xr_ogf).super_xr_object.m_motion_refs,pcVar2);
    local_20 = local_20 - 1;
    if (local_20 != 0) {
      std::__cxx11::string::operator+=
                ((string *)&(this->super_xr_ogf).super_xr_object.m_motion_refs,',');
    }
  }
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0x18);
  return;
}

Assistant:

inline void xr_ogf_v4::load_s_motion_refs_1(xr_reader& r)
{
	for (uint_fast32_t n = r.r_u32(); n > 0;) {
		m_motion_refs += r.skip_sz();
		if (--n)
			m_motion_refs += ',';
	}
	set_chunk_loaded(OGF4_S_MOTION_REFS_1);
}